

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall IR::BranchInstr::IsLoopTail(BranchInstr *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  Type *ppBVar6;
  undefined1 local_48 [8];
  Iterator __iter;
  
  if ((func->field_0x242 & 0x20) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x7e9,"(func->isPostLower)","func->isPostLower");
    if (!bVar2) {
LAB_004be54b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar4 = 0;
  if ((this->m_branchTarget->field_0x78 & 1) != 0) {
    local_48 = (undefined1  [8])&this->m_branchTarget->labelRefs;
    __iter.list = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    __iter.current = (NodeBase *)0x0;
    while( true ) {
      if (__iter.list == (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) goto LAB_004be54b;
        *puVar5 = 0;
      }
      __iter.list = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])__iter.list == local_48) break;
      ppBVar6 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_48);
      uVar3 = Instr::GetNumber(&(*ppBVar6)->super_Instr);
      if (uVar4 < uVar3) {
        __iter.current = (NodeBase *)*ppBVar6;
        uVar4 = Instr::GetNumber((Instr *)__iter.current);
      }
    }
    uVar4 = (uint32)((BranchInstr *)__iter.current == this);
  }
  return SUB41(uVar4,0);
}

Assistant:

bool
BranchInstr::IsLoopTail(Func * func)
{
    Assert(func->isPostLower);
    IR::LabelInstr * target = this->GetTarget();
    if (!target->m_isLoopTop)
    {
        return false;
    }

    IR::BranchInstr * lastBranchInstr = nullptr;
    uint32 lastBranchNum = 0;
    FOREACH_SLISTCOUNTED_ENTRY(IR::BranchInstr *, ref, &target->labelRefs)
    {
        if (ref->GetNumber() > lastBranchNum)
        {
            lastBranchInstr = ref;
            lastBranchNum = lastBranchInstr->GetNumber();
        }
    }
    NEXT_SLISTCOUNTED_ENTRY;

    if (this == lastBranchInstr)
    {
        return true;
    }
    return false;
}